

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ObjCleanData_rec(Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                  ,0xf5,"void Aig_ObjCleanData_rec(Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsCo(pObj);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      pAVar2 = Aig_ObjFanin0(pObj);
      Aig_ObjCleanData_rec(pAVar2);
      pAVar2 = Aig_ObjFanin1(pObj);
      Aig_ObjCleanData_rec(pAVar2);
    }
    (pObj->field_5).pData = (void *)0x0;
    return;
  }
  __assert_fail("!Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                ,0xf6,"void Aig_ObjCleanData_rec(Aig_Obj_t *)");
}

Assistant:

void Aig_ObjCleanData_rec( Aig_Obj_t * pObj )
{
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCo(pObj) );
    if ( Aig_ObjIsAnd(pObj) )
    {
        Aig_ObjCleanData_rec( Aig_ObjFanin0(pObj) );
        Aig_ObjCleanData_rec( Aig_ObjFanin1(pObj) );
    }
    pObj->pData = NULL;
}